

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTaskManager.hpp
# Opt level: O1

void __thiscall sftm::CTaskManager::Start(CTaskManager *this,uint32_t nInitWorkers)

{
  uint32_t uVar1;
  ulong uVar2;
  CWorker *this_00;
  long lVar3;
  
  uVar2 = 0x3f;
  if (nInitWorkers < 0x41) {
    uVar2 = (ulong)nInitWorkers;
  }
  uVar1 = (uint32_t)uVar2;
  this->m_nWorkerCount = uVar1;
  lVar3 = 0;
  do {
    *(CTaskManager **)((long)(this->m_workers)._M_elems[0].m_taskQueue.m_pItems + lVar3 + -0x28) =
         this;
    *(uint32_t *)((long)(this->m_workers)._M_elems[0].m_taskQueue.m_pItems + lVar3 + -0x20) = uVar1;
    *(condition_variable **)
     ((long)(this->m_workers)._M_elems[0].m_taskQueue.m_pItems + lVar3 + -0x18) =
         &this->m_cvWorkerIdle;
    *(mutex **)((long)(this->m_workers)._M_elems[0].m_taskQueue.m_pItems + lVar3 + -0x10) =
         &this->m_mtxWorkerIdle;
    lVar3 = lVar3 + 0x1030;
  } while (uVar2 * 0x1030 + 0x1030 != lVar3);
  if (uVar1 != 0) {
    this_00 = (this->m_workers)._M_elems;
    do {
      this_00 = this_00 + 1;
      CWorker::Start(this_00);
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  return;
}

Assistant:

void Start(std::uint32_t nInitWorkers) noexcept
		{
			if (nInitWorkers > MAX_WORKERS)
				nInitWorkers = MAX_WORKERS - 1;
			m_nWorkerCount = nInitWorkers;

			for (std::uint32_t nWorker = 0; nWorker <= nInitWorkers; nWorker++)
			{
				m_workers[nWorker].m_ownerData.m_pWorkers		= &m_workers[0];
				m_workers[nWorker].m_ownerData.m_nWorkerCount	= nInitWorkers;
				m_workers[nWorker].m_ownerData.m_pCvWorkerIdle	= &m_cvWorkerIdle;
				m_workers[nWorker].m_ownerData.m_pMutWorkerIdle = &m_mtxWorkerIdle;
			}

			for (std::uint32_t nWorker = 1; nWorker <= nInitWorkers; nWorker++)
			{
				m_workers[nWorker].Start();
			}
		}